

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_aggregate.cpp
# Opt level: O1

vector<unsigned_long,_true> * __thiscall
duckdb::LogicalAggregate::GetTableIndex
          (vector<unsigned_long,_true> *__return_storage_ptr__,LogicalAggregate *this)

{
  iterator __position;
  initializer_list<unsigned_long> __l;
  allocator_type local_29;
  idx_t local_28;
  idx_t iStack_20;
  
  local_28 = this->group_index;
  iStack_20 = this->aggregate_index;
  __l._M_len = 2;
  __l._M_array = &local_28;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             __l,&local_29);
  if (this->groupings_index != 0xffffffffffffffff) {
    __position._M_current =
         (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                 __position,&this->groupings_index);
    }
    else {
      *__position._M_current = this->groupings_index;
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> LogicalAggregate::GetTableIndex() const {
	vector<idx_t> result {group_index, aggregate_index};
	if (groupings_index != DConstants::INVALID_INDEX) {
		result.push_back(groupings_index);
	}
	return result;
}